

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  SRes SVar1;
  int __result___7;
  int __result___6;
  int __result___5;
  int __result___4;
  int __result___3;
  int __result___2;
  int __result___1;
  int __result__;
  UInt64 type;
  UInt64 *dataOffset_local;
  CBuf *pCStack_30;
  UInt32 numTempBufs_local;
  CBuf *tempBufs_local;
  CSzData *pCStack_20;
  UInt32 numFoldersMax_local;
  CSzData *sd_local;
  CSzAr *p_local;
  
  (ssi->sdSizes).Data = (Byte *)0x0;
  (ssi->sdSizes).Size = 0;
  (ssi->sdCRCs).Data = (Byte *)0x0;
  (ssi->sdCRCs).Size = 0;
  (ssi->sdNumSubStreams).Data = (Byte *)0x0;
  (ssi->sdNumSubStreams).Size = 0;
  *dataOffset = 0;
  type = (UInt64)dataOffset;
  dataOffset_local._4_4_ = numTempBufs;
  pCStack_30 = tempBufs;
  tempBufs_local._4_4_ = numFoldersMax;
  pCStack_20 = sd;
  sd_local = (CSzData *)p;
  p_local._4_4_ = ReadNumber(sd,(UInt64 *)&__result___1);
  if (((p_local._4_4_ == 0) &&
      ((___result___1 != 6 ||
       (((p_local._4_4_ = ReadNumber(pCStack_20,(UInt64 *)type), p_local._4_4_ == 0 &&
         (p_local._4_4_ = ReadPackInfo((CSzAr *)sd_local,pCStack_20,alloc), p_local._4_4_ == 0)) &&
        (p_local._4_4_ = ReadNumber(pCStack_20,(UInt64 *)&__result___1), p_local._4_4_ == 0)))))) &&
     ((___result___1 != 7 ||
      ((p_local._4_4_ =
             ReadUnpackInfo((CSzAr *)sd_local,pCStack_20,tempBufs_local._4_4_,pCStack_30,
                            dataOffset_local._4_4_,alloc), p_local._4_4_ == 0 &&
       (p_local._4_4_ = ReadNumber(pCStack_20,(UInt64 *)&__result___1), p_local._4_4_ == 0)))))) {
    if (___result___1 == 8) {
      SVar1 = ReadSubStreamsInfo((CSzAr *)sd_local,pCStack_20,ssi);
      if (SVar1 != 0) {
        return SVar1;
      }
      SVar1 = ReadNumber(pCStack_20,(UInt64 *)&__result___1);
      if (SVar1 != 0) {
        return SVar1;
      }
    }
    else {
      ssi->NumTotalSubStreams = *(UInt32 *)((long)&sd_local->Data + 4);
    }
    p_local._4_4_ = 4;
    if (___result___1 == 0) {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    /* ssi->NumSubDigests = 0; */
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}